

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple_management.hpp
# Opt level: O1

void burst::management::manage<char>(operation_t todo,void *source,void *destination)

{
  switch(todo) {
  case copy:
  case move:
    *(undefined1 *)destination = *source;
    break;
  case destroy:
    if (source != (void *)0x0) {
      __assert_fail("source == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/detail/dynamic_tuple_management.hpp"
                    ,0x56,
                    "void burst::management::manage(operation_t, const void *, void *) [T = char]");
    }
    break;
  case size:
    if (source != (void *)0x0) {
      __assert_fail("source == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/detail/dynamic_tuple_management.hpp"
                    ,0x5c,
                    "void burst::management::manage(operation_t, const void *, void *) [T = char]");
    }
    *(undefined8 *)destination = 1;
    break;
  case type:
    if (source != (void *)0x0) {
      __assert_fail("source == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/detail/dynamic_tuple_management.hpp"
                    ,0x62,
                    "void burst::management::manage(operation_t, const void *, void *) [T = char]");
    }
    *(undefined **)destination = &char::typeinfo;
  }
  return;
}

Assistant:

void manage (operation_t todo, const void * source, void * destination)
        {
            switch (todo)
            {
                case operation_t::copy:
                {
                    copy<T>(source, destination);
                    break;
                }
                case operation_t::move:
                {
                    move<T>(const_cast<void *>(source), destination);
                    break;
                }
                case operation_t::destroy:
                {
                    assert(source == nullptr);
                    destroy<T>(destination);
                    break;
                }
                case operation_t::size:
                {
                    assert(source == nullptr);
                    *static_cast<std::size_t *>(destination) = sizeof(T);
                    break;
                }
                case operation_t::type:
                {
                    assert(source == nullptr);
                    *static_cast<const std::type_info **>(destination) = std::addressof(typeid(T));
                    break;
                }
            }
        }